

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * google::protobuf::internal::PackedEnumParserArg
                 (void *object,char *ptr,ParseContext *ctx,_func_bool_void_ptr_int *is_valid,
                 void *data,InternalMetadataWithArenaLite *metadata,int field_num)

{
  byte bVar1;
  uint64 val;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  char *ptr_00;
  uint uVar5;
  int iVar6;
  int iVar7;
  pair<const_char_*,_bool> pVar8;
  pair<const_char_*,_int> pVar9;
  uint64 varint;
  
  bVar1 = *ptr;
  uVar5 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar9 = ReadSizeFallback(ptr,(uint)bVar1);
    uVar5 = pVar9.second;
    ptr_00 = pVar9.first;
    if (ptr_00 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    ptr_00 = ptr + 1;
  }
  pcVar3 = (ctx->super_EpsCopyInputStream).buffer_end_;
  uVar5 = ((int)ptr_00 - (int)pcVar3) + uVar5;
  pcVar3 = pcVar3 + (int)((int)uVar5 >> 0x1f & uVar5);
  (ctx->super_EpsCopyInputStream).limit_end_ = pcVar3;
  iVar4 = (ctx->super_EpsCopyInputStream).limit_;
  (ctx->super_EpsCopyInputStream).limit_ = uVar5;
  iVar4 = iVar4 - uVar5;
  if (-1 < iVar4) {
    while (ptr_00 < pcVar3) {
LAB_0016f1f9:
      ptr_00 = VarintParse<unsigned_long>(ptr_00,&varint);
      val = varint;
      if (ptr_00 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar7 = (int)varint;
      bVar2 = (*is_valid)(data,iVar7);
      if (bVar2) {
        iVar6 = *object;
        if (iVar6 == *(int *)((long)object + 4)) {
          RepeatedField<int>::Reserve((RepeatedField<int> *)object,iVar6 + 1);
          iVar6 = *object;
        }
        *(int *)object = iVar6 + 1;
        *(int *)(*(long *)((long)object + 8) + (long)iVar6 * 4) = iVar7;
      }
      else {
        if ((*(ulong *)metadata & 1) == 0) {
          s = InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
              ::mutable_unknown_fields_slow
                        ((InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                          *)metadata);
        }
        else {
          s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (*(ulong *)metadata & 0xfffffffffffffffe);
        }
        WriteVarint(field_num,val,s);
      }
      pcVar3 = (ctx->super_EpsCopyInputStream).limit_end_;
    }
    if ((long)ptr_00 - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
        (long)(ctx->super_EpsCopyInputStream).limit_) {
      pVar8 = EpsCopyInputStream::DoneFallback(&ctx->super_EpsCopyInputStream,ptr_00,-1);
      ptr_00 = pVar8.first;
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_0016f1f9;
    }
    if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
      uVar5 = iVar4 + (ctx->super_EpsCopyInputStream).limit_;
      (ctx->super_EpsCopyInputStream).limit_ = uVar5;
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar5 >> 0x1f & uVar5);
      return ptr_00;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* PackedEnumParserArg(void* object, const char* ptr,
                                ParseContext* ctx,
                                bool (*is_valid)(const void*, int),
                                const void* data,
                                InternalMetadataWithArenaLite* metadata,
                                int field_num) {
  return ctx->ReadPackedVarint(
      ptr, [object, is_valid, data, metadata, field_num](uint64 val) {
        if (is_valid(data, val)) {
          static_cast<RepeatedField<int>*>(object)->Add(val);
        } else {
          WriteVarint(field_num, val, metadata->mutable_unknown_fields());
        }
      });
}